

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

void __thiscall test_rope::initialize_tensors(test_rope *this,ggml_context *ctx)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> data;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  for (piVar2 = (int *)ggml_get_first_tensor(ctx); piVar2 != (int *)0x0;
      piVar2 = (int *)ggml_get_next_tensor(ctx,piVar2)) {
    if (*piVar2 == 0x1a) {
      lVar4 = (this->ne_a)._M_elems[2] << ((byte)this->mode >> 2 & 2);
      uVar3 = (uint)lVar4;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar3,&local_49);
      if (0 < (int)uVar3) {
        uVar5 = 0;
        do {
          iVar1 = rand();
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] = iVar1 % this->n_ctx;
          uVar5 = uVar5 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar5);
      }
      ggml_backend_tensor_set
                (piVar2,local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,0,(lVar4 << 0x20) >> 0x1e);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      init_tensor_uniform((ggml_tensor *)0x13e16d,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                // pos
                const int num_pos_ids = (mode & GGML_ROPE_TYPE_MROPE) ? ne_a[2] * 4 : ne_a[2];
                std::vector<int> data(num_pos_ids);
                for (int i = 0; i < num_pos_ids; i++) {
                    data[i] = rand() % n_ctx;
                }
                ggml_backend_tensor_set(t, data.data(), 0, num_pos_ids * sizeof(int));
            } else {
                if (t->ne[0] == n_dims/2) {
                    // frequency factors in the range [0.9f, 1.1f]
                    init_tensor_uniform(t, 0.9f, 1.1f);
                } else {
                    init_tensor_uniform(t);
                }
            }
        }
    }